

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization_utils.cpp
# Opt level: O1

vector<duckdb::LogicalType,_true> * duckdb::CMUtils::StringTypes(void)

{
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_91;
  LogicalType local_90 [4];
  LogicalType local_30;
  
  LogicalType::LogicalType(local_90,UTINYINT);
  LogicalType::LogicalType(local_90 + 1,USMALLINT);
  LogicalType::LogicalType(local_90 + 2,UINTEGER);
  LogicalType::LogicalType(local_90 + 3,UBIGINT);
  LogicalType::LogicalType(&local_30,HUGEINT);
  __l._M_len = 5;
  __l._M_array = local_90;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (in_RDI,__l,&local_91);
  lVar1 = 0x60;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_90[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return (vector<duckdb::LogicalType,_true> *)in_RDI;
}

Assistant:

const vector<LogicalType> CMUtils::StringTypes() {
	return {LogicalType::UTINYINT, LogicalType::USMALLINT, LogicalType::UINTEGER, LogicalType::UBIGINT,
	        LogicalType::HUGEINT};
}